

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-think-dungeon-util.c
# Opt level: O0

_Bool borg_money_scum(void)

{
  char *what;
  bool bVar1;
  borg_grid *ag;
  uint32_t local_10;
  int divisor;
  int dir;
  
  local_10 = 0xffffffff;
  ag._4_4_ = 2;
  if (borg_cfg[0x18] == 0) {
    divisor._3_1_ = false;
  }
  else {
    what = format("# Waiting for towns people to breed.  I need %d...",
                  (ulong)(uint)(borg_cfg[0x18] - borg.trait[0x2d]));
    borg_note(what);
    borg.in_shop = false;
    if (borg.trait[0x23] < 0x23) {
      if (borg.trait[0x23] < 0xf) {
        borg_keypress(0xe000);
        borg_keypress(0x52);
        borg_keypress(0x32);
        borg_keypress(0x35);
        borg_keypress(0x9c);
      }
      else {
        borg_keypress(0xe000);
        borg_keypress(0x52);
        borg_keypress(0x37);
        borg_keypress(0x35);
        borg_keypress(0x9c);
      }
    }
    else {
      borg_keypress(0xe000);
      borg_keypress(0x52);
      borg_keypress(0x35);
      borg_keypress(0x30);
      borg_keypress(0x30);
      borg_keypress(0x9c);
    }
    if ((long)turn % (long)((ulong)z_info->day_length * 10) <
        (long)(((ulong)z_info->day_length * 10) / 2)) {
      ag._4_4_ = 5;
    }
    if ((int)borg_t % ag._4_4_ != 0) {
      borg_keypress(0xe000);
      while( true ) {
        bVar1 = true;
        if ((local_10 != 0xffffffff) && (bVar1 = true, local_10 != 5)) {
          bVar1 = local_10 == 0;
        }
        if (!bVar1) break;
        local_10 = Rand_div(10);
        borg.goal.g.x = borg.c.x + ddx[(int)local_10];
        borg.goal.g.y = borg.c.y + ddy[(int)local_10];
        if (borg_grids[borg.goal.g.y][borg.goal.g.x].feat != '\x01') {
          local_10 = 0xffffffff;
        }
      }
      borg_keypress(local_10 + 0x30);
    }
    borg_t = 10;
    borg.time_this_panel = 1;
    borg_began = 1;
    divisor._3_1_ = true;
  }
  return divisor._3_1_;
}

Assistant:

bool borg_money_scum(void)
{

    int dir     = -1;
    int divisor = 2;

    borg_grid *ag;

    /* Just a quick check to make sure we are supposed to do this */
    if (borg_cfg[BORG_MONEY_SCUM_AMOUNT] == 0)
        return false;

    /* Take note */
    borg_note(format("# Waiting for towns people to breed.  I need %d...",
        borg_cfg[BORG_MONEY_SCUM_AMOUNT] - borg.trait[BI_GOLD]));

    /* I'm not in a store */
    borg.in_shop = false;

    /* Rest for 9 months */
    if (borg.trait[BI_CLEVEL] >= 35) {
        borg_keypress(ESCAPE);
        borg_keypress('R');
        borg_keypress('5');
        borg_keypress('0');
        borg_keypress('0');
        borg_keypress(KC_ENTER);
    } else if (borg.trait[BI_CLEVEL] >= 15) {
        borg_keypress(ESCAPE);
        borg_keypress('R');
        borg_keypress('7');
        borg_keypress('5');
        borg_keypress(KC_ENTER);
    } else /* Low level, dont want to get mobbed */
    {
        borg_keypress(ESCAPE);
        borg_keypress('R');
        borg_keypress('2');
        borg_keypress('5');
        borg_keypress(KC_ENTER);
    }

    /* Don't rest too long at night.  We tend to crash the game if too many
     * townsfolk are on the level
     */
    /* Night or day up in town */
    if ((turn % (10L * z_info->day_length)) < ((10L * z_info->day_length) / 2))
        divisor = 5;

    /* sometimes twitch in order to move around some */
    if (borg_t % divisor) {
        borg_keypress(ESCAPE);

        /* Pick a random direction */
        while (dir == -1 || dir == 5 || dir == 0) {
            dir = randint0(10);

            /* Hack -- set goal */
            borg.goal.g.x = borg.c.x + ddx[dir];
            borg.goal.g.y = borg.c.y + ddy[dir];

            ag            = &borg_grids[borg.goal.g.y][borg.goal.g.x];

            /* Skip walls and shops */
            if (ag->feat != FEAT_FLOOR)
                dir = -1;
        }

        /* Normally move */
        /* Send direction */
        borg_keypress(I2D(dir));
    }

    /* reset the clocks */
    borg_t               = 10;
    borg.time_this_panel = 1;
    borg_began           = 1;

    /* Done */
    return true;
}